

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_reaper.cc
# Opt level: O0

bool __thiscall
sptk::PitchExtractionByReaper::Get
          (PitchExtractionByReaper *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RCX;
  int iVar6;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  undefined4 *in_R8;
  float fVar7;
  double dVar8;
  int j;
  int i_1;
  double *output;
  int i;
  int num_epochs;
  int time_length;
  vector<short,_std::allocator<short>_> voicing;
  vector<float,_std::allocator<float>_> times;
  int target_length;
  vector<float,_std::allocator<float>_> correlation;
  vector<float,_std::allocator<float>_> tmp_f0;
  float external_frame_interval;
  bool track_result;
  int tmp;
  vector<short,_std::allocator<short>_> integer_waveform;
  EpochTracker epoch_tracker;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbe8;
  EpochTracker *in_stack_fffffffffffffbf0;
  EpochTracker *in_stack_fffffffffffffbf8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  float in_stack_fffffffffffffc18;
  undefined2 in_stack_fffffffffffffc1c;
  undefined1 in_stack_fffffffffffffc1e;
  undefined1 in_stack_fffffffffffffc1f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  float unvoiced_pm_interval;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  EpochTracker *in_stack_fffffffffffffc38;
  allocator *paVar9;
  EpochTracker *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  int iVar10;
  undefined8 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  int iVar11;
  vector<short,_std::allocator<short>_> local_358;
  vector<float,_std::allocator<float>_> local_340;
  pointer local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  float *local_300;
  float *local_2f8;
  int local_2ec;
  undefined1 local_2e8 [24];
  vector<float,_std::allocator<float>_> local_2d0;
  float local_2b8;
  allocator local_2b1;
  string local_2b0 [39];
  byte local_289;
  int local_288;
  int local_284;
  pointer local_280;
  pointer local_270;
  double *local_268;
  double *local_260;
  vector<short,_std::allocator<short>_> local_250;
  vector<short,_std::allocator<short>_> local_228 [7];
  string *in_stack_fffffffffffffe88;
  EpochTracker *in_stack_fffffffffffffe90;
  byte local_1;
  
  fVar7 = (float)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  if ((((ulong)in_RDI[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start & 1) == 0) ||
     (bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffc00._M_current), bVar1)) {
    local_1 = 0;
    goto LAB_0010cc7d;
  }
  reaper::EpochTracker::EpochTracker(in_stack_fffffffffffffc60);
  reaper::EpochTracker::set_unvoiced_cost
            ((EpochTracker *)local_228,
             (float)(double)in_RDI[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::allocator<short>::allocator((allocator<short> *)0x10c434);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)
             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             (size_type)in_stack_fffffffffffffc08._M_current,
             (allocator_type *)in_stack_fffffffffffffc00._M_current);
  std::allocator<short>::~allocator((allocator<short> *)0x10c460);
  local_260 = (double *)
              std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffbe8);
  local_268 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffbe8)
  ;
  local_270 = (pointer)std::vector<short,_std::allocator<short>_>::begin
                                 ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffbe8
                                 );
  local_280 = (pointer)std::
                       transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,sptk::PitchExtractionByReaper::Get(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,std::vector<double,std::allocator<double>>*,sptk::PitchExtractionInterface::Polarity*)const::__0>
                                 (local_260,local_268,local_270);
  std::vector<short,_std::allocator<short>_>::data
            ((vector<short,_std::allocator<short>_> *)0x10c4e2);
  std::vector<short,_std::allocator<short>_>::size(&local_250);
  bVar1 = reaper::EpochTracker::Init
                    (in_stack_fffffffffffffc38,
                     (int16_t *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                     (int32_t)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                     (float)in_stack_fffffffffffffc28,
                     (float)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                     SUB84(in_stack_fffffffffffffc20,0),(bool)in_stack_fffffffffffffc1f,
                     (bool)in_stack_fffffffffffffc1e);
  unvoiced_pm_interval = (float)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  if (bVar1) {
    if (in_R8 != (undefined4 *)0x0) {
      bVar1 = reaper::EpochTracker::ComputePolarity
                        (in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
      if (!bVar1) {
        local_1 = 0;
        local_284 = 1;
        goto LAB_0010cc45;
      }
      if (local_288 == 1) {
        *in_R8 = 1;
      }
      else if (local_288 == -1) {
        *in_R8 = 2;
      }
      else {
        *in_R8 = 0;
      }
    }
    if ((in_RDX == 0) && (in_RCX == (vector<double,_std::allocator<double>_> *)0x0)) {
LAB_0010c78a:
      if (in_RDX != 0) {
        local_2b8 = (float)*(int *)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_finish /
                    (float)(double)(in_RDI->super__Vector_base<float,_std::allocator<float>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        in_stack_fffffffffffffc20 = &local_2d0;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)0x10c7cf);
        unvoiced_pm_interval = (float)((ulong)local_2e8 >> 0x20);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)0x10c7e1);
        in_stack_fffffffffffffc37 =
             reaper::EpochTracker::ResampleAndReturnResults
                       ((EpochTracker *)
                        CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),fVar7,
                        (vector<float,_std::allocator<float>_> *)
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),in_RDI);
        if ((bool)in_stack_fffffffffffffc37) {
          sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
          fVar7 = (float)sVar2;
          in_stack_fffffffffffffc18 = (float)(long)sVar2;
          in_stack_fffffffffffffc1c = SUB42(fVar7,0);
          in_stack_fffffffffffffc1e = (undefined1)((uint)fVar7 >> 0x10);
          in_stack_fffffffffffffc1f = (undefined1)((uint)fVar7 >> 0x18);
          if (-1 < (long)sVar2) {
            in_stack_fffffffffffffc1c = SUB42(in_stack_fffffffffffffc18,0);
            in_stack_fffffffffffffc1e = (undefined1)((uint)in_stack_fffffffffffffc18 >> 0x10);
            in_stack_fffffffffffffc1f = (undefined1)((uint)in_stack_fffffffffffffc18 >> 0x18);
          }
          dVar8 = std::ceil((double)(ulong)(uint)((float)CONCAT13(in_stack_fffffffffffffc1f,
                                                                  CONCAT12(in_stack_fffffffffffffc1e
                                                                           ,
                                                  in_stack_fffffffffffffc1c)) /
                                                 (float)*(int *)&(in_RDI->
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl.super__Vector_impl_data._M_finish));
          in_stack_fffffffffffffc14 = SUB84(dVar8,0);
          in_stack_fffffffffffffc10 = (int)in_stack_fffffffffffffc14;
          local_2ec = in_stack_fffffffffffffc10;
          sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_2d0);
          if (in_stack_fffffffffffffc10 < (int)sVar2) {
            std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (size_type)in_stack_fffffffffffffc08._M_current);
          }
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                     (size_type)in_stack_fffffffffffffc08._M_current);
          in_stack_fffffffffffffc00._M_current = (double *)&local_2d0;
          local_2f8 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                         ((vector<float,_std::allocator<float>_> *)
                                          in_stack_fffffffffffffbe8);
          local_300 = (float *)std::vector<float,_std::allocator<float>_>::end
                                         ((vector<float,_std::allocator<float>_> *)
                                          in_stack_fffffffffffffbe8);
          local_308 = (double *)
                      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffbe8)
          ;
          __first._M_current._4_2_ = in_stack_fffffffffffffc1c;
          __first._M_current._0_4_ = in_stack_fffffffffffffc18;
          __first._M_current._6_1_ = in_stack_fffffffffffffc1e;
          __first._M_current._7_1_ = in_stack_fffffffffffffc1f;
          __last._M_current._4_4_ = in_stack_fffffffffffffc14;
          __last._M_current._0_4_ = in_stack_fffffffffffffc10;
          in_stack_fffffffffffffc08 =
               std::
               copy<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (__first,__last,in_stack_fffffffffffffc08);
          local_310 = in_stack_fffffffffffffc08._M_current;
          local_320 = (double *)
                      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffbe8)
          ;
          __last_00._M_current = (double *)&local_2d0;
          std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)__last_00._M_current);
          local_318 = (double *)
                      __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator+(__last_00._M_current,(difference_type)in_stack_fffffffffffffbf0);
          local_328 = (pointer)std::vector<double,_std::allocator<double>_>::end
                                         (in_stack_fffffffffffffbe8);
          std::vector<float,_std::allocator<float>_>::back
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffbf0);
          std::
          fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,float>
                    (in_stack_fffffffffffffc00,__last_00,(float *)in_stack_fffffffffffffbf0);
          local_284 = 0;
        }
        else {
          local_1 = 0;
          local_284 = 1;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc00._M_current);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc00._M_current);
        if (local_284 != 0) goto LAB_0010cc45;
      }
      if (in_RCX != (vector<double,_std::allocator<double>_> *)0x0) {
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)0x10ca6d);
        in_stack_fffffffffffffbf0 = (EpochTracker *)&local_358;
        std::vector<short,_std::allocator<short>_>::vector
                  ((vector<short,_std::allocator<short>_> *)0x10ca7f);
        reaper::EpochTracker::GetFilledEpochs
                  ((EpochTracker *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                   unvoiced_pm_interval,in_stack_fffffffffffffc20,
                   (vector<short,_std::allocator<short>_> *)
                   CONCAT17(in_stack_fffffffffffffc1f,
                            CONCAT16(in_stack_fffffffffffffc1e,
                                     CONCAT24(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)))
                  );
        sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_340);
        for (iVar11 = 0; iVar11 < (int)sVar2; iVar11 = iVar11 + 1) {
          std::vector<short,_std::allocator<short>_>::operator[](&local_358,(long)iVar11);
        }
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (size_type)in_stack_fffffffffffffc08._M_current);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
        iVar11 = 0;
        for (iVar10 = 0; iVar10 < (int)sVar2; iVar10 = iVar10 + 1) {
          pvVar4 = std::vector<short,_std::allocator<short>_>::operator[](&local_358,(long)iVar10);
          iVar6 = iVar11;
          if (*pvVar4 != 0) {
            pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_340,(long)iVar10)
            ;
            iVar6 = iVar11 + 1;
            pvVar3[iVar11] = (double)*pvVar5;
          }
          iVar11 = iVar6;
        }
        std::vector<short,_std::allocator<short>_>::~vector
                  ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffc00._M_current);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc00._M_current);
      }
      local_1 = 1;
      local_284 = 1;
    }
    else {
      bVar1 = reaper::EpochTracker::ComputeFeatures
                        ((EpochTracker *)in_stack_fffffffffffffc08._M_current);
      if (bVar1) {
        local_289 = reaper::EpochTracker::TrackEpochs(in_stack_fffffffffffffbf0);
        paVar9 = &local_2b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b0,"",paVar9);
        reaper::EpochTracker::WriteDiagnostics(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        if ((local_289 & 1) != 0) goto LAB_0010c78a;
        local_1 = 0;
        local_284 = 1;
      }
      else {
        local_1 = 0;
        local_284 = 1;
      }
    }
  }
  else {
    local_1 = 0;
    local_284 = 1;
  }
LAB_0010cc45:
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)in_stack_fffffffffffffc00._M_current);
  reaper::EpochTracker::~EpochTracker(in_stack_fffffffffffffbf0);
LAB_0010cc7d:
  return (bool)(local_1 & 1);
}

Assistant:

bool PitchExtractionByReaper::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  reaper::EpochTracker epoch_tracker;
  epoch_tracker.set_unvoiced_cost(static_cast<float>(voicing_threshold_));
  std::vector<int16_t> integer_waveform(waveform.size());
  std::transform(waveform.begin(), waveform.end(), integer_waveform.begin(),
                 [](double x) { return static_cast<int16_t>(x); });
  if (!epoch_tracker.Init(integer_waveform.data(),
                          static_cast<int32_t>(integer_waveform.size()),
                          static_cast<float>(sampling_rate_),
                          static_cast<float>(lower_f0_),
                          static_cast<float>(upper_f0_), true, false)) {
    return false;
  }

  if (NULL != polarity) {
    // ComputePolarity should be run before calling ComputeFeatures.
    int tmp;
    if (!epoch_tracker.ComputePolarity(&tmp)) {
      return false;
    }
    if (1 == tmp) {
      *polarity = PitchExtractionInterface::Polarity::kPositive;
    } else if (-1 == tmp) {
      *polarity = PitchExtractionInterface::Polarity::kNegative;
    } else {
      *polarity = PitchExtractionInterface::Polarity::kUnknown;
    }
  }

  if (NULL != f0 || NULL != epochs) {
    if (!epoch_tracker.ComputeFeatures()) {
      return false;
    }
    const bool track_result(epoch_tracker.TrackEpochs());
    epoch_tracker.WriteDiagnostics("");
    if (!track_result) {
      return false;
    }
  }

  if (NULL != f0) {
    const float external_frame_interval(static_cast<float>(frame_shift_) /
                                        static_cast<float>(sampling_rate_));
    std::vector<float> tmp_f0;
    std::vector<float> correlation;
    if (!epoch_tracker.ResampleAndReturnResults(external_frame_interval,
                                                &tmp_f0, &correlation)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<float>(waveform.size()) / frame_shift_)));
    if (target_length < static_cast<int>(tmp_f0.size())) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    std::vector<float> times;
    std::vector<int16_t> voicing;
    epoch_tracker.GetFilledEpochs(reaper::kUnvoicedPulseInterval, &times,
                                  &voicing);

    const int time_length(static_cast<int>(times.size()));
    int num_epochs(0);
    for (int i(0); i < time_length; ++i) {
      if (voicing[i]) ++num_epochs;
    }
    epochs->resize(num_epochs);
    double* output(&((*epochs)[0]));
    for (int i(0), j(0); i < time_length; ++i) {
      if (voicing[i]) output[j++] = times[i];
    }
  }

  return true;
}